

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *
image_match::get_image_paths
          (vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           *__return_storage_ptr__,path *root)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  source_loc loc;
  source_loc loc_00;
  bool bVar2;
  logger *plVar3;
  path *ppVar4;
  path local_1e0;
  value_type local_1b8;
  string local_190;
  string_view_t local_170;
  source_loc local_160;
  string local_148;
  string_view_t local_128;
  source_loc local_118;
  directory_entry *local_100;
  directory_entry *dir_entry;
  undefined1 local_e8 [8];
  recursive_directory_iterator __end1;
  undefined1 local_c8 [8];
  recursive_directory_iterator __begin1;
  recursive_directory_iterator *__range1;
  string local_98;
  path local_68;
  undefined1 local_40 [8];
  path normalized;
  path *root_local;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  *image_paths;
  
  normalized._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )root;
  std::filesystem::absolute(&local_68);
  std::filesystem::__cxx11::path::lexically_normal();
  CLI::std::filesystem::__cxx11::path::~path((path *)&local_68);
  CLI::std::filesystem::__cxx11::path::string(&local_98,(path *)local_40);
  spdlog::info<char[27],std::__cxx11::string>
            ((char (*) [27])"Searching for images in {}",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  CLI::std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ::vector((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
            *)__return_storage_ptr__);
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&__begin1._M_dirs._M_refcount,(path *)local_40);
  p_Var1 = &__begin1._M_dirs._M_refcount;
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&__end1._M_dirs._M_refcount,
             (recursive_directory_iterator *)p_Var1);
  std::filesystem::__cxx11::begin
            ((__cxx11 *)local_c8,(recursive_directory_iterator *)&__end1._M_dirs._M_refcount);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&__end1._M_dirs._M_refcount);
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&dir_entry,(recursive_directory_iterator *)p_Var1);
  std::filesystem::__cxx11::end((recursive_directory_iterator *)local_e8);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&dir_entry);
  while (bVar2 = std::filesystem::__cxx11::operator!=
                           ((recursive_directory_iterator *)local_c8,
                            (recursive_directory_iterator *)local_e8), bVar2) {
    local_100 = (directory_entry *)
                std::filesystem::__cxx11::recursive_directory_iterator::operator*
                          ((recursive_directory_iterator *)local_c8);
    plVar3 = spdlog::default_logger_raw();
    spdlog::source_loc::source_loc
              (&local_118,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
               ,0xad,"get_image_paths");
    ::fmt::v7::basic_string_view<char>::basic_string_view(&local_128,"Found file {}");
    ppVar4 = CLI::std::filesystem::__cxx11::directory_entry::path(local_100);
    CLI::std::filesystem::__cxx11::path::string(&local_148,ppVar4);
    loc.line = local_118.line;
    loc._12_4_ = local_118._12_4_;
    loc.filename = local_118.filename;
    loc.funcname = local_118.funcname;
    spdlog::logger::log<std::__cxx11::string>(plVar3,loc,debug,local_128,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    ppVar4 = CLI::std::filesystem::__cxx11::directory_entry::path(local_100);
    bVar2 = is_valid_file((path *)ppVar4);
    if (bVar2) {
      plVar3 = spdlog::default_logger_raw();
      spdlog::source_loc::source_loc
                (&local_160,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
                 ,0xb0,"get_image_paths");
      ::fmt::v7::basic_string_view<char>::basic_string_view(&local_170,"Adding file {}");
      ppVar4 = CLI::std::filesystem::__cxx11::directory_entry::path(local_100);
      CLI::std::filesystem::__cxx11::path::string(&local_190,ppVar4);
      loc_00.line = local_160.line;
      loc_00._12_4_ = local_160._12_4_;
      loc_00.filename = local_160.filename;
      loc_00.funcname = local_160.funcname;
      spdlog::logger::log<std::__cxx11::string>(plVar3,loc_00,debug,local_170,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      CLI::std::filesystem::__cxx11::directory_entry::path(local_100);
      std::filesystem::absolute(&local_1e0);
      std::filesystem::__cxx11::path::lexically_normal();
      std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
      push_back(__return_storage_ptr__,&local_1b8);
      CLI::std::filesystem::__cxx11::path::~path((path *)&local_1b8);
      CLI::std::filesystem::__cxx11::path::~path((path *)&local_1e0);
    }
    std::filesystem::__cxx11::recursive_directory_iterator::operator++
              ((recursive_directory_iterator *)local_c8);
  }
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)local_e8);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)local_c8);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&__begin1._M_dirs._M_refcount);
  CLI::std::filesystem::__cxx11::path::~path((path *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::filesystem::path>
get_image_paths(const std::filesystem::path& root)
{
    auto normalized = fs::absolute(root).lexically_normal();
    spdlog::info("Searching for images in {}", normalized.string());

    std::vector<fs::path> image_paths;
    for (auto&& dir_entry : fs::recursive_directory_iterator(normalized)) {
        SPDLOG_DEBUG("Found file {}", dir_entry.path().string());

        if (is_valid_file(dir_entry.path())) {
            SPDLOG_DEBUG("Adding file {}", dir_entry.path().string());

            image_paths.push_back(
              fs::absolute(dir_entry.path()).lexically_normal());
        }
    }

    return image_paths;
}